

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O0

double getflt(void)

{
  double dVar1;
  double d_modern;
  char *cp;
  char str [100];
  int c;
  bool local_89;
  char *local_80;
  char local_78 [108];
  int local_c;
  double local_8;
  
  local_80 = local_78;
  do {
    local_c = get();
    local_89 = local_c == 0x20 || local_c == 9;
  } while (local_89);
  while( true ) {
    while ((0x2f < local_c && (local_c < 0x3a))) {
      *local_80 = (char)local_c;
      local_c = get();
      local_80 = local_80 + 1;
    }
    if (local_c != 0x2e) break;
    *local_80 = (char)local_c;
    local_c = get();
    local_80 = local_80 + 1;
  }
  if ((local_c == 0x2b) || (local_c == 0x2d)) {
    *local_80 = 'e';
    local_80[1] = (char)local_c;
    local_c = get();
    local_80 = local_80 + 2;
    while (0x2f < local_c && local_c < 0x3a) {
      *local_80 = (char)local_c;
      local_c = get();
      local_80 = local_80 + 1;
    }
  }
  *local_80 = '\0';
  local_8 = atof(local_78);
  if (local_c == 0x7c) {
    dVar1 = getflt();
    local_8 = local_8 / dVar1;
  }
  else {
    peekc = local_c;
  }
  return local_8;
}

Assistant:

static double getflt() {
	int c;
	char str[100];
	char* cp;
	double d_modern;

	cp = str;
	do
		c = get();
	while(c == ' ' || c == '\t');

l1:
	if(c >= '0' && c <= '9') {
		*cp++ = c;
		c = get();
		goto l1;
	}
	if(c == '.') {
		*cp++ = c;
		c = get();
		goto l1;
	}
	if(c == '+' || c == '-') {
		*cp++ = 'e';
		*cp++ = c;
		c = get();
		while(c >= '0' && c <= '9') {
			*cp++ = c;
			c = get();
		}
	}
	*cp = '\0';
	d_modern = atof(str);
	if(c == '|') {
		d_modern /= getflt();
		return d_modern;
	}
	peekc = c;
	return(d_modern);
}